

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O2

int SetThrustersSSC32(SSC32 *pSSC32,double urt,double ult)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int pws [32];
  int selectedchannels [32];
  
  selectedchannels[0] = 0;
  selectedchannels[1] = 0;
  selectedchannels[2] = 0;
  selectedchannels[3] = 0;
  selectedchannels[4] = 0;
  selectedchannels[5] = 0;
  selectedchannels[6] = 0;
  selectedchannels[7] = 0;
  selectedchannels[8] = 0;
  selectedchannels[9] = 0;
  selectedchannels[10] = 0;
  selectedchannels[0xb] = 0;
  selectedchannels[0xc] = 0;
  selectedchannels[0xd] = 0;
  selectedchannels[0xe] = 0;
  selectedchannels[0xf] = 0;
  selectedchannels[0x10] = 0;
  selectedchannels[0x11] = 0;
  selectedchannels[0x12] = 0;
  selectedchannels[0x13] = 0;
  selectedchannels[0x14] = 0;
  selectedchannels[0x15] = 0;
  selectedchannels[0x16] = 0;
  selectedchannels[0x17] = 0;
  selectedchannels[0x18] = 0;
  selectedchannels[0x19] = 0;
  selectedchannels[0x1a] = 0;
  selectedchannels[0x1b] = 0;
  selectedchannels[0x1c] = 0;
  selectedchannels[0x1d] = 0;
  selectedchannels[0x1e] = 0;
  selectedchannels[0x1f] = 0;
  pws[0] = 0;
  pws[1] = 0;
  pws[2] = 0;
  pws[3] = 0;
  pws[4] = 0;
  pws[5] = 0;
  pws[6] = 0;
  pws[7] = 0;
  pws[8] = 0;
  pws[9] = 0;
  pws[10] = 0;
  pws[0xb] = 0;
  pws[0xc] = 0;
  pws[0xd] = 0;
  pws[0xe] = 0;
  pws[0xf] = 0;
  pws[0x10] = 0;
  pws[0x11] = 0;
  pws[0x12] = 0;
  pws[0x13] = 0;
  pws[0x14] = 0;
  pws[0x15] = 0;
  pws[0x16] = 0;
  pws[0x17] = 0;
  pws[0x18] = 0;
  pws[0x19] = 0;
  pws[0x1a] = 0;
  pws[0x1b] = 0;
  pws[0x1c] = 0;
  pws[0x1d] = 0;
  pws[0x1e] = 0;
  pws[0x1f] = 0;
  iVar2 = pSSC32->rightthrusterchan;
  pws[iVar2] = (int)(urt * 1000.0 * 0.5) + 0x5dc;
  iVar1 = pSSC32->leftthrusterchan;
  pws[iVar1] = (int)(ult * 1000.0 * 0.5) + 0x5dc;
  iVar3 = pws[iVar2];
  if (1999 < iVar3) {
    iVar3 = 2000;
  }
  if (iVar3 < 0x3e9) {
    iVar3 = 1000;
  }
  pws[iVar2] = iVar3;
  iVar3 = 2000;
  if (pws[iVar1] < 2000) {
    iVar3 = pws[iVar1];
  }
  if (iVar3 < 0x3e9) {
    iVar3 = 1000;
  }
  pws[iVar1] = iVar3;
  selectedchannels[iVar2] = 1;
  selectedchannels[iVar1] = 1;
  iVar2 = SetAllPWMsSSC32(pSSC32,selectedchannels,pws);
  return iVar2;
}

Assistant:

inline int SetThrustersSSC32(SSC32* pSSC32, double urt, double ult)
{
	int selectedchannels[NB_CHANNELS_PWM_SSC32];
	int pws[NB_CHANNELS_PWM_SSC32];

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert u (in [-1;1]) into SSC32 pulse width (in us).
	pws[pSSC32->rightthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(urt*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(ult*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);

	pws[pSSC32->rightthrusterchan] = max(min(pws[pSSC32->rightthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftthrusterchan] = max(min(pws[pSSC32->leftthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	selectedchannels[pSSC32->rightthrusterchan] = 1;
	selectedchannels[pSSC32->leftthrusterchan] = 1;

	return SetAllPWMsSSC32(pSSC32, selectedchannels, pws);
}